

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DbFreeNN(sqlite3 *db,void *p)

{
  undefined8 *in_RSI;
  long in_RDI;
  LookasideSlot *pBuf_1;
  LookasideSlot *pBuf;
  void *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  
  if (in_RDI != 0) {
    if (in_RSI < *(undefined8 **)(in_RDI + 0x1e8)) {
      if (*(undefined8 **)(in_RDI + 0x1d8) <= in_RSI) {
        *in_RSI = *(undefined8 *)(in_RDI + 0x1d0);
        *(undefined8 **)(in_RDI + 0x1d0) = in_RSI;
        return;
      }
      if (*(undefined8 **)(in_RDI + 0x1e0) <= in_RSI) {
        *in_RSI = *(undefined8 *)(in_RDI + 0x1c0);
        *(undefined8 **)(in_RDI + 0x1c0) = in_RSI;
        return;
      }
    }
    if (*(long *)(in_RDI + 0x300) != 0) {
      measureAllocationSize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      return;
    }
  }
  sqlite3_free((void *)0x1527b0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DbFreeNN(sqlite3 *db, void *p){
  assert( db==0 || sqlite3_mutex_held(db->mutex) );
  assert( p!=0 );
  if( db ){
    if( ((uptr)p)<(uptr)(db->lookaside.pEnd) ){
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
      if( ((uptr)p)>=(uptr)(db->lookaside.pMiddle) ){
        LookasideSlot *pBuf = (LookasideSlot*)p;
        assert( db->pnBytesFreed==0 );
#ifdef SQLITE_DEBUG
        memset(p, 0xaa, LOOKASIDE_SMALL);  /* Trash freed content */
#endif
        pBuf->pNext = db->lookaside.pSmallFree;
        db->lookaside.pSmallFree = pBuf;
        return;
      }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
      if( ((uptr)p)>=(uptr)(db->lookaside.pStart) ){
        LookasideSlot *pBuf = (LookasideSlot*)p;
        assert( db->pnBytesFreed==0 );
#ifdef SQLITE_DEBUG
        memset(p, 0xaa, db->lookaside.szTrue);  /* Trash freed content */
#endif
        pBuf->pNext = db->lookaside.pFree;
        db->lookaside.pFree = pBuf;
        return;
      }
    }
    if( db->pnBytesFreed ){
      measureAllocationSize(db, p);
      return;
    }
  }
  assert( sqlite3MemdebugHasType(p, (MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
  assert( sqlite3MemdebugNoType(p, (u8)~(MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
  assert( db!=0 || sqlite3MemdebugNoType(p, MEMTYPE_LOOKASIDE) );
  sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
  sqlite3_free(p);
}